

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O2

string * __thiscall
pbrt::MediumInterface::ToString_abi_cxx11_(string *__return_storage_ptr__,MediumInterface *this)

{
  ulong uVar1;
  ulong uVar2;
  char **in_R8;
  char *local_80;
  string local_78;
  char *local_58;
  string local_50;
  
  uVar1 = (this->inside).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  local_80 = "(nullptr)";
  if ((uVar1 & 0xffffffffffff) != 0) {
    MediumHandle::ToString_abi_cxx11_(&local_50,&this->inside);
    local_80 = local_50._M_dataplus._M_p;
  }
  uVar2 = (this->outside).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  local_58 = "(nullptr)";
  if ((uVar2 & 0xffffffffffff) != 0) {
    MediumHandle::ToString_abi_cxx11_(&local_78,&this->outside);
    local_58 = local_78._M_dataplus._M_p;
  }
  StringPrintf<char_const*,char_const*>
            (__return_storage_ptr__,(pbrt *)"[ MediumInterface inside: %s outside: %s ]",
             (char *)&local_80,&local_58,in_R8);
  if ((uVar2 & 0xffffffffffff) != 0) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((uVar1 & 0xffffffffffff) != 0) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MediumInterface::ToString() const {
    return StringPrintf("[ MediumInterface inside: %s outside: %s ]",
                        inside ? inside.ToString().c_str() : "(nullptr)",
                        outside ? outside.ToString().c_str() : "(nullptr)");
}